

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::SetNavID(ImGuiID id,ImGuiNavLayer nav_layer,ImGuiID focus_scope_id,ImRect *rect_rel)

{
  ImVec2 *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  
  pIVar4 = GImGui;
  GImGui->NavId = id;
  pIVar4->NavLayer = nav_layer;
  SetNavFocusScope(focus_scope_id);
  pIVar2 = pIVar4->NavWindow;
  pIVar2->NavLastIds[nav_layer] = id;
  IVar3 = rect_rel->Max;
  pIVar1 = &pIVar2->NavRectRel[nav_layer].Min;
  *pIVar1 = rect_rel->Min;
  pIVar1[1] = IVar3;
  pIVar1 = GImGui->NavWindow->RootWindowForNav->NavPreferredScoringPosRel + GImGui->NavLayer;
  pIVar1->x = 3.4028235e+38;
  pIVar1->y = 3.4028235e+38;
  return;
}

Assistant:

void ImGui::SetNavID(ImGuiID id, ImGuiNavLayer nav_layer, ImGuiID focus_scope_id, const ImRect& rect_rel)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.NavWindow != NULL);
    IM_ASSERT(nav_layer == ImGuiNavLayer_Main || nav_layer == ImGuiNavLayer_Menu);
    g.NavId = id;
    g.NavLayer = nav_layer;
    SetNavFocusScope(focus_scope_id);
    g.NavWindow->NavLastIds[nav_layer] = id;
    g.NavWindow->NavRectRel[nav_layer] = rect_rel;

    // Clear preferred scoring position (NavMoveRequestApplyResult() will tend to restore it)
    NavClearPreferredPosForAxis(ImGuiAxis_X);
    NavClearPreferredPosForAxis(ImGuiAxis_Y);
}